

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadType(BinaryReader *this,Type *out_value,char *desc)

{
  Result RVar1;
  uint32_t type;
  
  type = 0;
  RVar1 = ReadS32Leb128(this,&type,desc);
  if (RVar1.enum_ != Error) {
    out_value->enum_ = type;
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReader::ReadType(Type* out_value, const char* desc) {
  uint32_t type = 0;
  CHECK_RESULT(ReadS32Leb128(&type, desc));
  *out_value = static_cast<Type>(type);
  return Result::Ok;
}